

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O1

LY_ERR lyd_diff_reverse_remove_op_r(lyd_node *diff,lyd_diff_op op)

{
  LY_ERR in_EAX;
  lyd_diff_op lVar1;
  LY_ERR extraout_EAX;
  lyd_meta *meta;
  char *str;
  lyd_node *plVar2;
  lyd_node_inner *plVar3;
  lys_module *plVar4;
  lyd_node *plVar5;
  
  plVar5 = diff;
  if (diff != (lyd_node *)0x0) {
    do {
      meta = lyd_find_meta(plVar5->meta,(lys_module *)0x0,"yang:operation");
      if (meta != (lyd_meta *)0x0) {
        str = (meta->value)._canonical;
        if (str == (char *)0x0) {
          str = lyd_value_get_canonical(meta->annotation->module->ctx,&meta->value);
        }
        lVar1 = lyd_diff_str2op(str);
        if (lVar1 != op) {
          if (diff->schema == (lysc_node *)0x0) {
            plVar4 = (lys_module *)&diff[2].schema;
          }
          else {
            plVar4 = diff->schema->module;
          }
          ly_log(plVar4->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                 0x8b5);
          return extraout_EAX;
        }
        lyd_free_meta_single(meta);
      }
      if ((plVar5->schema == (lysc_node *)0x0) || ((plVar5->schema->nodetype & 0x711) != 0)) {
        plVar2 = *(lyd_node **)(plVar5 + 1);
      }
      else {
        plVar2 = (lyd_node *)0x0;
      }
      if (plVar2 == (lyd_node *)0x0) {
        if (plVar5 == diff) {
          return LY_SUCCESS;
        }
        plVar2 = plVar5->next;
      }
      if (plVar2 == (lyd_node *)0x0) {
        for (plVar3 = plVar5->parent;
            ((plVar3->field_0).node.parent != diff->parent &&
            (plVar2 = (plVar3->field_0).node.next, plVar2 == (lyd_node *)0x0));
            plVar3 = (plVar3->field_0).node.parent) {
        }
      }
      plVar5 = plVar2;
    } while (plVar2 != (lyd_node *)0x0);
    in_EAX = LY_SUCCESS;
  }
  return in_EAX;
}

Assistant:

static LY_ERR
lyd_diff_reverse_remove_op_r(struct lyd_node *diff, enum lyd_diff_op op)
{
    struct lyd_node *elem;
    struct lyd_meta *meta;

    LYD_TREE_DFS_BEGIN(diff, elem) {
        meta = lyd_find_meta(elem->meta, NULL, "yang:operation");
        if (meta) {
            LY_CHECK_ERR_RET(lyd_diff_str2op(lyd_get_meta_value(meta)) != op, LOGINT(LYD_CTX(diff)), LY_EINT);
            lyd_free_meta_single(meta);
        }

        LYD_TREE_DFS_END(diff, elem);
    }

    return LY_SUCCESS;
}